

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

void ddClearFlag(DdNode *f)

{
  DdNode *f_local;
  
  if ((((ulong)f->next & 1) != 0) &&
     (f->next = (DdNode *)((ulong)f->next & 0xfffffffffffffffe), f->index != 0x7fffffff)) {
    ddClearFlag((f->type).kids.T);
    ddClearFlag((DdNode *)((ulong)(f->type).kids.E & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

static void
ddClearFlag(
  DdNode * f)
{
    if (!Cudd_IsComplement(f->next)) {
	return;
    }
    /* Clear visited flag. */
    f->next = Cudd_Regular(f->next);
    if (cuddIsConstant(f)) {
	return;
    }
    ddClearFlag(cuddT(f));
    ddClearFlag(Cudd_Regular(cuddE(f)));
    return;

}